

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# holding_property.cpp
# Opt level: O0

void __thiscall HoldingProperty_MoveTo_Test::TestBody(HoldingProperty_MoveTo_Test *this)

{
  IdHolder *this_00;
  bool bVar1;
  Movable *pMVar2;
  char *pcVar3;
  AssertHelper local_e8;
  Message local_e0;
  int local_d4;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar_3;
  Message local_b8;
  int local_ac;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar_2;
  IdHolder move_from_other;
  Message local_88;
  int local_80 [2];
  undefined1 local_78 [8];
  AssertionResult gtest_ar_1;
  Message local_60 [3];
  int local_44;
  undefined1 local_40 [8];
  AssertionResult gtest_ar;
  Movable local_28;
  int remembered_value;
  Movable move_from;
  HoldingMovableType obj;
  HoldingProperty_MoveTo_Test *this_local;
  
  HoldingMovableType::HoldingMovableType((HoldingMovableType *)&remembered_value);
  Movable::Movable(&local_28);
  gtest_ar.message_.ptr_._4_4_ = Movable::getId(&local_28);
  prop::HoldingProperty<HoldingMovableType,Movable,0ul,prop::ReadWrite>::operator=
            ((HoldingProperty<HoldingMovableType,Movable,0ul,prop::ReadWrite> *)&remembered_value,
             &local_28);
  pMVar2 = prop::detail::
           PropertyRealValueBase<prop::HoldingProperty<HoldingMovableType,_Movable,_0UL,_prop::ReadWrite>,_Movable>
           ::operator()((PropertyRealValueBase<prop::HoldingProperty<HoldingMovableType,_Movable,_0UL,_prop::ReadWrite>,_Movable>
                         *)&remembered_value);
  local_44 = Movable::getId(pMVar2);
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_40,"remembered_value","obj.value1().getId()",
             (int *)((long)&gtest_ar.message_.ptr_ + 4),&local_44);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar1) {
    testing::Message::Message(local_60);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_40);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/holding_property.cpp"
               ,0x1de,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  local_80[1] = 0;
  local_80[0] = Movable::getId(&local_28);
  testing::internal::EqHelper<true>::Compare<int,int>
            ((char *)local_78,"0",(int *)"move_from.getId()",local_80 + 1,local_80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
  if (!bVar1) {
    testing::Message::Message(&local_88);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_78);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffff70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/holding_property.cpp"
               ,0x1df,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xffffffffffffff70,&local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff70);
    testing::Message::~Message(&local_88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
  this_00 = (IdHolder *)((long)&gtest_ar_2.message_.ptr_ + 4);
  IdHolder::IdHolder(this_00);
  gtest_ar.message_.ptr_._4_4_ = gtest_ar_2.message_.ptr_._4_4_;
  prop::HoldingProperty<HoldingMovableType,Movable,0ul,prop::ReadWrite>::operator=
            ((HoldingProperty<HoldingMovableType,Movable,0ul,prop::ReadWrite> *)&remembered_value,
             this_00);
  pMVar2 = prop::detail::
           PropertyRealValueBase<prop::HoldingProperty<HoldingMovableType,_Movable,_0UL,_prop::ReadWrite>,_Movable>
           ::operator()((PropertyRealValueBase<prop::HoldingProperty<HoldingMovableType,_Movable,_0UL,_prop::ReadWrite>,_Movable>
                         *)&remembered_value);
  local_ac = Movable::getId(pMVar2);
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_a8,"remembered_value","obj.value1().getId()",
             (int *)((long)&gtest_ar.message_.ptr_ + 4),&local_ac);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
  if (!bVar1) {
    testing::Message::Message(&local_b8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/holding_property.cpp"
               ,0x1e4,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
  local_d4 = 0;
  testing::internal::EqHelper<true>::Compare<int,int>
            ((char *)local_d0,"0",(int *)"move_from_other.id",&local_d4,
             (type *)((long)&gtest_ar_2.message_.ptr_ + 4));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
  if (!bVar1) {
    testing::Message::Message(&local_e0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_d0);
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/holding_property.cpp"
               ,0x1e5,pcVar3);
    testing::internal::AssertHelper::operator=(&local_e8,&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    testing::Message::~Message(&local_e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
  return;
}

Assistant:

TEST(HoldingProperty, MoveTo)
{
  HoldingMovableType obj;
  Movable move_from;
  auto remembered_value = move_from.getId();
  obj.value1 = std::move( move_from );
  EXPECT_EQ( remembered_value, obj.value1().getId() );
  EXPECT_EQ( 0, move_from.getId() );
  
  IdHolder move_from_other;
  remembered_value = move_from_other.id;
  obj.value1 = std::move( move_from_other );
  EXPECT_EQ( remembered_value, obj.value1().getId() );
  EXPECT_EQ( 0, move_from_other.id );
}